

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall google::protobuf::FieldDescriptor::InternalTypeOnceInit(FieldDescriptor *this)

{
  LogMessage *pLVar1;
  long lVar2;
  long *plVar3;
  undefined4 uVar4;
  long *plVar5;
  Symbol SVar6;
  string name;
  int *local_100 [2];
  int local_f0 [10];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  LogMessage local_68;
  
  if (*(char *)(*(long *)(this + 0x28) + 0x41) == '\0') {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1beb);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: file()->finished_building_ == true: ");
    internal::LogFinisher::operator=((LogFinisher *)local_100,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (*(string **)(this + 0x80) != (string *)0x0) {
    SVar6 = DescriptorPool::CrossLinkOnDemandHelper
                      (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),*(string **)(this + 0x80)
                       ,false);
    if (SVar6.type == MESSAGE) {
      lVar2 = 0x68;
      uVar4 = 0xb;
    }
    else {
      if (SVar6.type != ENUM) goto LAB_002e941a;
      lVar2 = 0x70;
      uVar4 = 0xe;
    }
    *(undefined4 *)(this + 0x38) = uVar4;
    *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + lVar2) = SVar6.field_1;
  }
LAB_002e941a:
  if ((*(long *)(this + 0x70) != 0) && (*(long *)(this + 0x90) == 0)) {
    if (*(long *)(this + 0x88) != 0) {
      plVar3 = *(long **)(*(long *)(this + 0x70) + 8);
      lVar2 = *plVar3;
      local_100[0] = &((LogMessage *)local_100)->line_;
      std::__cxx11::string::_M_construct<char*>((string *)local_100,lVar2,plVar3[1] + lVar2);
      lVar2 = std::__cxx11::string::rfind('\0',0x2e);
      if (lVar2 == -1) {
        std::__cxx11::string::_M_assign((string *)local_100);
      }
      else {
        std::__cxx11::string::substr((ulong)local_88,(ulong)local_100);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_88);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_b8 = *plVar5;
          lStack_b0 = plVar3[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar5;
          local_c8 = (long *)*plVar3;
        }
        local_c0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c8,**(ulong **)(this + 0x88));
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_98 = *plVar5;
          lStack_90 = plVar3[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar5;
          local_a8 = (long *)*plVar3;
        }
        local_a0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_100,(string *)&local_a8);
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
      }
      SVar6 = DescriptorPool::CrossLinkOnDemandHelper
                        (*(DescriptorPool **)(*(long *)(this + 0x28) + 0x10),(string *)local_100,
                         false);
      if (SVar6.type == ENUM_VALUE) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(this + 0x90) = SVar6.field_1;
      }
      if (local_100[0] != &((LogMessage *)local_100)->line_) {
        operator_delete(local_100[0]);
      }
    }
    if (*(long *)(this + 0x90) == 0) {
      if (*(int *)(*(long *)(this + 0x70) + 0x2c) == 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_100,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1c0b);
        pLVar1 = internal::LogMessage::operator<<
                           ((LogMessage *)local_100,"CHECK failed: enum_type_->value_count(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar1);
        internal::LogMessage::~LogMessage((LogMessage *)local_100);
      }
      *(undefined8 *)(this + 0x90) = *(undefined8 *)(*(long *)(this + 0x70) + 0x30);
    }
  }
  return;
}

Assistant:

void FieldDescriptor::InternalTypeOnceInit() const {
  GOOGLE_CHECK(file()->finished_building_ == true);
  if (type_name_) {
    Symbol result = file()->pool()->CrossLinkOnDemandHelper(
        *type_name_, type_ == FieldDescriptor::TYPE_ENUM);
    if (result.type == Symbol::MESSAGE) {
      type_ = FieldDescriptor::TYPE_MESSAGE;
      message_type_ = result.descriptor;
    } else if (result.type == Symbol::ENUM) {
      type_ = FieldDescriptor::TYPE_ENUM;
      enum_type_ = result.enum_descriptor;
    }
  }
  if (enum_type_ && !default_value_enum_) {
    if (default_value_enum_name_) {
      // Have to build the full name now instead of at CrossLink time,
      // because enum_type_ may not be known at the time.
      std::string name = enum_type_->full_name();
      // Enum values reside in the same scope as the enum type.
      std::string::size_type last_dot = name.find_last_of('.');
      if (last_dot != std::string::npos) {
        name = name.substr(0, last_dot) + "." + *default_value_enum_name_;
      } else {
        name = *default_value_enum_name_;
      }
      Symbol result = file()->pool()->CrossLinkOnDemandHelper(name, true);
      if (result.type == Symbol::ENUM_VALUE) {
        default_value_enum_ = result.enum_value_descriptor;
      }
    }
    if (!default_value_enum_) {
      // We use the first defined value as the default
      // if a default is not explicitly defined.
      GOOGLE_CHECK(enum_type_->value_count());
      default_value_enum_ = enum_type_->value(0);
    }
  }
}